

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_markdown_generator.cc
# Opt level: O2

void __thiscall t_markdown_generator::generate_program_toc(t_markdown_generator *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&this->f_out_,
                           "| Module | Services & Functions | Data types | Constants |");
  poVar1 = std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(poVar1,"| --- | --- | --- | --- |");
  std::operator<<(poVar1,'\n');
  generate_program_toc_row(this,(this->super_t_generator).program_);
  std::operator<<((ostream *)&this->f_out_,'\n');
  return;
}

Assistant:

void t_markdown_generator::generate_program_toc() {
  f_out_ << "| Module | Services & Functions | Data types | Constants |" << endl 
         << "| --- | --- | --- | --- |" << endl;
  generate_program_toc_row(program_);
  f_out_ << endl;
}